

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_waitable_timer.hpp
# Opt level: O3

size_t __thiscall
asio::
basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::cancel(basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
         *this)

{
  size_t sVar1;
  error_code __ec;
  error_code ec;
  error_code local_40;
  system_error local_30 [32];
  
  local_40._M_value = 0;
  local_40._M_cat = (error_category *)std::_V2::system_category();
  sVar1 = detail::
          deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          ::cancel(&((this->
                     super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
                     ).service_)->service_impl_,
                   &(this->
                    super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
                    ).implementation_,&local_40);
  __ec._4_4_ = 0;
  __ec._M_value = local_40._M_value;
  if (local_40._M_value != 0) {
    __ec._M_cat = local_40._M_cat;
    std::system_error::system_error(local_30,__ec,"cancel");
    detail::throw_exception<std::system_error>(local_30);
    std::system_error::~system_error(local_30);
  }
  return sVar1;
}

Assistant:

std::size_t cancel()
  {
    asio::error_code ec;
    std::size_t s = this->get_service().cancel(this->get_implementation(), ec);
    asio::detail::throw_error(ec, "cancel");
    return s;
  }